

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_search.c
# Opt level: O0

ps_search_t *
fsg_search_init(char *name,fsg_model_t *fsg,ps_config_t *config,acmod_t *acmod,dict_t *dict,
               dict2pid_t *d2p)

{
  logmath_t *plVar1;
  int iVar2;
  fsg_model_t *pfVar3;
  hmm_context_t *phVar4;
  fsg_history_t *pfVar5;
  double dVar6;
  dict_t *pdVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  fsg_search_t *fsgs;
  dict2pid_t *d2p_local;
  dict_t *dict_local;
  acmod_t *acmod_local;
  ps_config_t *config_local;
  fsg_model_t *fsg_local;
  char *name_local;
  
  name_local = (char *)__ckd_calloc__(1,0x130,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                                      ,0xb6);
  pdVar7 = dict;
  ps_search_init((ps_search_t *)name_local,&fsg_funcs,"fsg",name,config,acmod,dict,d2p);
  uVar9 = (undefined4)((ulong)d2p >> 0x20);
  uVar8 = (undefined4)((ulong)pdVar7 >> 0x20);
  pfVar3 = fsg_model_retain(fsg);
  ((fsg_search_t *)name_local)->fsg = pfVar3;
  phVar4 = hmm_context_init(acmod->mdef->n_emit_state,acmod->tmat->tp,(int16 *)0x0,acmod->mdef->sseq
                           );
  ((fsg_search_t *)name_local)->hmmctx = phVar4;
  if (((fsg_search_t *)name_local)->hmmctx == (hmm_context_t *)0x0) {
    (*((((fsg_search_t *)name_local)->base).vt)->free)((ps_search_t *)name_local);
    name_local = (char *)0x0;
  }
  else {
    pfVar5 = fsg_history_init((fsg_model_t *)0x0,dict);
    ((fsg_search_t *)name_local)->history = pfVar5;
    ((fsg_search_t *)name_local)->frame = -1;
    ((fsg_search_t *)name_local)->beam_factor = 1.0;
    plVar1 = acmod->lmath;
    dVar6 = ps_config_float(config,"beam");
    iVar2 = logmath_log(plVar1,(float64)dVar6);
    ((fsg_search_t *)name_local)->beam_orig = iVar2 >> 10;
    ((fsg_search_t *)name_local)->beam = iVar2 >> 10;
    plVar1 = acmod->lmath;
    dVar6 = ps_config_float(config,"pbeam");
    iVar2 = logmath_log(plVar1,(float64)dVar6);
    ((fsg_search_t *)name_local)->pbeam_orig = iVar2 >> 10;
    ((fsg_search_t *)name_local)->pbeam = iVar2 >> 10;
    plVar1 = acmod->lmath;
    dVar6 = ps_config_float(config,"wbeam");
    iVar2 = logmath_log(plVar1,(float64)dVar6);
    ((fsg_search_t *)name_local)->wbeam_orig = iVar2 >> 10;
    ((fsg_search_t *)name_local)->wbeam = iVar2 >> 10;
    dVar6 = ps_config_float(config,"lw");
    ((fsg_search_t *)name_local)->lw = (float32)(float)dVar6;
    plVar1 = acmod->lmath;
    dVar6 = ps_config_float(config,"pip");
    iVar2 = logmath_log(plVar1,(float64)dVar6);
    ((fsg_search_t *)name_local)->pip =
         (int)((float)iVar2 * (float)((fsg_search_t *)name_local)->lw) >> 10;
    plVar1 = acmod->lmath;
    dVar6 = ps_config_float(config,"wip");
    iVar2 = logmath_log(plVar1,(float64)dVar6);
    ((fsg_search_t *)name_local)->wip =
         (int)((float)iVar2 * (float)((fsg_search_t *)name_local)->lw) >> 10;
    dVar6 = ps_config_float(config,"ascale");
    ((fsg_search_t *)name_local)->ascale = (float32)(float)(1.0 / dVar6);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
            ,0xe0,"FSG(beam: %d, pbeam: %d, wbeam: %d; wip: %d, pip: %d)\n",
            (ulong)(uint)((fsg_search_t *)name_local)->beam_orig,
            (ulong)(uint)((fsg_search_t *)name_local)->pbeam_orig,
            CONCAT44(uVar8,((fsg_search_t *)name_local)->wbeam_orig),
            CONCAT44(uVar9,((fsg_search_t *)name_local)->wip),((fsg_search_t *)name_local)->pip);
    iVar2 = fsg_search_check_dict((fsg_search_t *)name_local,fsg);
    if (iVar2 == 0) {
      fsg_search_free((ps_search_t *)name_local);
      name_local = (char *)0x0;
    }
    else {
      iVar2 = ps_config_bool(config,"fsgusefiller");
      if ((iVar2 != 0) && (fsg->silwords == (bitvec_t *)0x0)) {
        fsg_search_add_silences((fsg_search_t *)name_local,fsg);
      }
      iVar2 = ps_config_bool(config,"fsgusealtpron");
      if ((iVar2 != 0) && (fsg->altwords == (bitvec_t *)0x0)) {
        fsg_search_add_altpron((fsg_search_t *)name_local,fsg);
      }
      iVar2 = ps_config_bool(config,"bestpath");
      if (iVar2 != 0) {
        ((fsg_search_t *)name_local)->bestpath = '\x01';
      }
      iVar2 = fsg_search_reinit((ps_search_t *)name_local,(((fsg_search_t *)name_local)->base).dict,
                                (((fsg_search_t *)name_local)->base).d2p);
      if (iVar2 < 0) {
        (*((((fsg_search_t *)name_local)->base).vt)->free)((ps_search_t *)name_local);
        name_local = (char *)0x0;
      }
      else {
        ptmr_init(&((fsg_search_t *)name_local)->perf);
      }
    }
  }
  return (ps_search_t *)name_local;
}

Assistant:

ps_search_t *
fsg_search_init(const char *name,
		fsg_model_t *fsg,
                ps_config_t *config,
                acmod_t *acmod,
                dict_t *dict,
                dict2pid_t *d2p)
{
    fsg_search_t *fsgs = ckd_calloc(1, sizeof(*fsgs));
    ps_search_init(ps_search_base(fsgs), &fsg_funcs, PS_SEARCH_TYPE_FSG, name, config, acmod, dict, d2p);

    fsgs->fsg = fsg_model_retain(fsg);
    /* Initialize HMM context. */
    fsgs->hmmctx = hmm_context_init(bin_mdef_n_emit_state(acmod->mdef),
                                    acmod->tmat->tp, NULL, acmod->mdef->sseq);
    if (fsgs->hmmctx == NULL) {
        ps_search_free(ps_search_base(fsgs));
        return NULL;
    }

    /* Initialize the search history object */
    fsgs->history = fsg_history_init(NULL, dict);
    fsgs->frame = -1;

    /* Get search pruning parameters */
    fsgs->beam_factor = 1.0f;
    fsgs->beam = fsgs->beam_orig
        = (int32) logmath_log(acmod->lmath, ps_config_float(config, "beam"))
        >> SENSCR_SHIFT;
    fsgs->pbeam = fsgs->pbeam_orig
        = (int32) logmath_log(acmod->lmath, ps_config_float(config, "pbeam"))
        >> SENSCR_SHIFT;
    fsgs->wbeam = fsgs->wbeam_orig
        = (int32) logmath_log(acmod->lmath, ps_config_float(config, "wbeam"))
        >> SENSCR_SHIFT;

    /* LM related weights/penalties */
    fsgs->lw = ps_config_float(config, "lw");
    fsgs->pip = (int32) (logmath_log(acmod->lmath, ps_config_float(config, "pip"))
                           * fsgs->lw)
        >> SENSCR_SHIFT;
    fsgs->wip = (int32) (logmath_log(acmod->lmath, ps_config_float(config, "wip"))
                           * fsgs->lw)
        >> SENSCR_SHIFT;

    /* Acoustic score scale for posterior probabilities. */
    fsgs->ascale = 1.0 / ps_config_float(config, "ascale");

    E_INFO("FSG(beam: %d, pbeam: %d, wbeam: %d; wip: %d, pip: %d)\n",
           fsgs->beam_orig, fsgs->pbeam_orig, fsgs->wbeam_orig,
           fsgs->wip, fsgs->pip);

    if (!fsg_search_check_dict(fsgs, fsg)) {
        fsg_search_free(ps_search_base(fsgs));
        return NULL;
    }

    if (ps_config_bool(config, "fsgusefiller") &&
        !fsg_model_has_sil(fsg))
        fsg_search_add_silences(fsgs, fsg);

    if (ps_config_bool(config, "fsgusealtpron") &&
        !fsg_model_has_alt(fsg))
        fsg_search_add_altpron(fsgs, fsg);

#if __FSG_ALLOW_BESTPATH__
    /* If bestpath is enabled, hypotheses are generated from a ps_lattice_t.
     * This is not allowed by default because it tends to be very slow. */
    if (ps_config_bool(config, "bestpath"))
        fsgs->bestpath = TRUE;
#endif

    if (fsg_search_reinit(ps_search_base(fsgs),
                          ps_search_dict(fsgs),
                          ps_search_dict2pid(fsgs)) < 0)
    {
        ps_search_free(ps_search_base(fsgs));
        return NULL;
    
    }
    ptmr_init(&fsgs->perf);
        
    return ps_search_base(fsgs);
}